

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void basics(void)

{
  _Setprecision _Var1;
  _Setw _Var2;
  ostream *poVar3;
  ulong uVar4;
  char *pcVar5;
  int in_stack_000000e8;
  float CONVERSION;
  char BLANK;
  int NO_OF_STUDENTS;
  double CONVERSION_CENTIMETER;
  int local_d0;
  char _num;
  int i;
  string bob;
  int local_ac;
  undefined8 uStack_a8;
  int badNums [5];
  int array1 [5];
  int bigNum2;
  int bigNum;
  allocator local_59;
  string local_58 [8];
  string thing;
  int num;
  int five;
  int largestIntPlusOne;
  int largestInt;
  double otherFavNum;
  float favNum;
  int myAge;
  bool isSad;
  bool isHappy;
  char myGrade;
  double PI;
  
  poVar3 = std::operator<<((ostream *)&std::cout,"Hello, bro World!");
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_58,"thing",&local_59);
  std::allocator<char>::~allocator((allocator<char> *)&local_59);
  printf("HI person!\n");
  poVar3 = std::operator<<((ostream *)&std::cout,"Favorite number ");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,3.141529);
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  poVar3 = std::operator<<((ostream *)&std::cout,"Size of double: ");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,8);
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  poVar3 = std::operator<<((ostream *)&std::cout,"Size of char: ");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,1);
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  poVar3 = std::operator<<((ostream *)&std::cout,"Size of bool: ");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,1);
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  poVar3 = std::operator<<((ostream *)&std::cout,"Size of bool: ");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,1);
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  poVar3 = std::operator<<((ostream *)&std::cout,"Size of int: ");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,4);
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  poVar3 = std::operator<<((ostream *)&std::cout,"Size of float: ");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,4);
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  poVar3 = std::operator<<((ostream *)&std::cout,"Size of double: ");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,8);
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  poVar3 = std::operator<<((ostream *)&std::cout,"Largest possible int: ");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,0x7fffffff);
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  poVar3 = std::operator<<((ostream *)&std::cout,"Largest possible int plus one: ");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,-0x80000000);
  poVar3 = std::operator<<(poVar3," causes code to break.");
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  poVar3 = std::operator<<((ostream *)&std::cout,"5 ++ = ");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,5);
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  poVar3 = std::operator<<((ostream *)&std::cout,"++ 5 = ");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,7);
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  poVar3 = std::operator<<((ostream *)&std::cout,"5 -- = ");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,7);
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  poVar3 = std::operator<<((ostream *)&std::cout,"-- 5 = ");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,5);
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  poVar3 = std::operator<<((ostream *)&std::cout,"num += 1: ");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,0xb);
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  poVar3 = std::operator<<((ostream *)&std::cout,"(1 + 3 * 5): ");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,0x10);
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  poVar3 = std::operator<<((ostream *)&std::cout,"string: ");
  poVar3 = std::operator<<(poVar3,local_58);
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  poVar3 = std::operator<<((ostream *)&std::cout,"4 / 5 = ");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,0);
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  poVar3 = std::operator<<((ostream *)&std::cout,"4 / 5 = ");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,0.8);
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  poVar3 = std::operator<<((ostream *)&std::cout,"4 / 5 = ");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,0.8);
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  poVar3 = std::operator<<((ostream *)&std::cout,"4 / 5 = ");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,0);
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  poVar3 = std::operator<<((ostream *)&std::cout,"bigNum: ");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,5);
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  poVar3 = std::operator<<((ostream *)&std::cout,"bigNum: ");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,2);
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  uStack_a8 = 0xc00000005;
  badNums[0] = 10;
  badNums[1] = 5;
  badNums[2] = 2;
  poVar3 = std::operator<<((ostream *)&std::cout,"bad numbers: ");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,&uStack_a8);
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  poVar3 = std::operator<<((ostream *)&std::cout,"bad numbers: ");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,uStack_a8._4_4_);
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  poVar3 = std::operator<<((ostream *)&std::cout,"bad numbers: ");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_ac);
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  poVar3 = std::operator<<((ostream *)&std::cout,"bad numbers: ");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,badNums[2]);
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  poVar3 = std::operator<<((ostream *)&std::cout,"bad numbers: ");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,badNums[3]);
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  poVar3 = std::operator<<((ostream *)&std::cout,"bad numbers: ");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,in_stack_000000e8);
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  poVar3 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,7);
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  poVar3 = std::operator<<((ostream *)&std::cout,"static_cast<double> (25) = ");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,25.0);
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  poVar3 = std::operator<<((ostream *)&std::cout,"static_cast<double> (5 + 3) = ");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,8.0);
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  poVar3 = std::operator<<((ostream *)&std::cout,"static_cast<double> (15) / 2 = ");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,7.5);
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  poVar3 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,7);
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  poVar3 = std::operator<<((ostream *)&std::cout,"static_cast<int> (\'A\') = ");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,0x41);
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  poVar3 = std::operator<<((ostream *)&std::cout,"static_cast<int> (\'B\') = ");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,0x42);
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  poVar3 = std::operator<<((ostream *)&std::cout,"static_cast<char> (65) = ");
  poVar3 = std::operator<<(poVar3,'A');
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  poVar3 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0x83);
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  poVar3 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0x83);
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&i,"Bob",(allocator *)&_num);
  std::allocator<char>::~allocator((allocator<char> *)&_num);
  poVar3 = std::operator<<((ostream *)&std::cout,"bob = ");
  poVar3 = std::operator<<(poVar3,(string *)&i);
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  local_d0 = 0;
  while( true ) {
    uVar4 = std::__cxx11::string::size();
    if (uVar4 <= (ulong)(long)local_d0) break;
    poVar3 = std::operator<<((ostream *)&std::cout,"bob[");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_d0);
    poVar3 = std::operator<<(poVar3,"] = ");
    pcVar5 = (char *)std::__cxx11::string::operator[]((ulong)&i);
    poVar3 = std::operator<<(poVar3,*pcVar5);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    local_d0 = local_d0 + 1;
  }
  poVar3 = std::operator<<((ostream *)&std::cout,"\'2\' + \'B\' = ");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,0x74);
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  _Var1 = std::setprecision(2);
  poVar3 = std::operator<<((ostream *)&std::cout,_Var1);
  poVar3 = std::operator<<(poVar3,"Set precision(2) of 5.323 = ");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,5.323);
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  _Var1 = std::setprecision(1);
  poVar3 = std::operator<<((ostream *)&std::cout,_Var1);
  poVar3 = std::operator<<(poVar3,"Set precision(1) of 5.323 = ");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,5.323);
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  _Var2 = std::setw(0x1a);
  poVar3 = std::operator<<((ostream *)&std::cout,_Var2);
  poVar3 = std::operator<<(poVar3,"H I J K L M N O P Q R S T");
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  poVar3 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,std::fixed);
  std::ostream::operator<<(poVar3,std::showpoint);
  _Var2 = std::setw(10);
  poVar3 = std::operator<<((ostream *)&std::cout,_Var2);
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,20.56);
  _Var2 = std::setw(10);
  poVar3 = std::operator<<(poVar3,_Var2);
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,50.2);
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  _Var2 = std::setw(10);
  poVar3 = std::operator<<((ostream *)&std::cout,_Var2);
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,20.56);
  _Var2 = std::setw(10);
  poVar3 = std::operator<<(poVar3,_Var2);
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,50.2);
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  poVar3 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,2.54);
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  poVar3 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,2.54);
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  poVar3 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,5);
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  std::__cxx11::string::~string((string *)&i);
  std::__cxx11::string::~string(local_58);
  return;
}

Assistant:

void basics() {
    cout << "Hello, bro World!" << endl;
    const double PI = 3.1415926535;  // like float but usually accurate up to 15 digits. (8 bytes)
    char myGrade = 'A';  // 1 byte in memory
    bool isHappy = true;  // 1  (1 byte)
    bool isSad = false;  // 0  (1 byte)
    int myAge = 39;  // 4 bytes
    float favNum = 3.141529;  // 4 bytes
    double otherFavNum = 1.6180339887;  // 8 bytes.
    int largestInt = 2147483647;  // 2^31 since 4 bytes have 32 bits. 0 including reduces it to 31.
    int largestIntPlusOne = 2147483648;  // 2^31 since 4 bytes have 32 bits. 0 including reduces it to 31.
    int five = 5;
    int num = 10;
    num += 1;
    string thing = "thing";
    printf("HI person!\n");


    // =================== PRINT STUFF ========================
    cout << "Favorite number " << favNum << endl;
    cout << "Size of double: " << sizeof(PI) << endl;
    cout << "Size of char: " << sizeof(myGrade) << endl;
    cout << "Size of bool: " << sizeof(isHappy) << endl;
    cout << "Size of bool: " << sizeof(isSad) << endl;
    cout << "Size of int: " << sizeof(myAge) << endl;
    cout << "Size of float: " << sizeof(favNum) << endl;
    cout << "Size of double: " << sizeof(otherFavNum) << endl;
    cout << "Largest possible int: " << largestInt << endl;
    cout << "Largest possible int plus one: " << largestIntPlusOne << " causes code to break." << endl;
    cout << "5 ++ = " << five++ << endl;  // this increments 5 to 6  (increments AFTER).
    cout << "++ 5 = " << ++five << endl;  // this increments 6 by 1 equalling 7  (increments BEFORE).
    cout << "5 -- = " << five-- << endl;  //
    cout << "-- 5 = " << --five << endl;
    cout << "num += 1: " << num << endl;
    cout << "(1 + 3 * 5): " << 1 + 3 * 5 << endl;
    cout << "string: " << thing << endl;
    cout << "4 / 5 = " << 4 / 5 << endl;
    cout << "4 / 5 = " << (float) 4 / 5 << endl;  // how I wrote (float)... It is called casting.
    cout << "4 / 5 = " << (double) 4 / 5 << endl;  // how I wrote (double)... It is called casting.
    cout << "4 / 5 = " << (int) 4 / 5 << endl;  // how I wrote (int)... It is called casting.

    // ternary operator
    // variable = (condition) ? true : false
    int bigNum = (5 > 2) ? 5 : 2;
    cout << "bigNum: " << bigNum << endl;
    int bigNum2 = (1 > 2) ? 5 : 2;
    cout << "bigNum: " << bigNum2 << endl;

    // Arrays
    int array1[5];  // store 5 elements.
    int badNums[5] = {5, 12, 10, 5, 2};
    cout << "bad numbers: " << badNums << endl;
    cout << "bad numbers: " << badNums[1] << endl;
    cout << "bad numbers: " << badNums[-1] << endl;
    cout << "bad numbers: " << badNums[4] << endl;
    cout << "bad numbers: " << badNums[5] << endl;
    cout << "bad numbers: " << badNums[100] << endl;

    // Casting
    cout << static_cast<int> (7.9) << endl;

    cout << "static_cast<double> (25) = "
         << static_cast<double> (25) << endl;

    cout << "static_cast<double> (5 + 3) = "
         << static_cast<double> (5 + 3) << endl;

    cout << "static_cast<double> (15) / 2 = "
         << static_cast<double> (15) / 2 << endl;

    cout << (15) / 2 << endl;

    cout << "static_cast<int> ('A') = "
    << static_cast<int> ('A') << endl;

    cout << "static_cast<int> ('B') = "
    << static_cast<int> ('B') << endl;

    cout << "static_cast<char> (65) = "
    << static_cast<char> (65) << endl;

    cout << 'A' + 'B' << endl;
    cout << static_cast<int> ('A') + static_cast<int> ('B') << endl;

    string bob = "Bob";
    cout << "bob = " << bob << endl;
    for (int i = 0; i < bob.size(); i++) {
        cout << "bob[" << i << "] = " << bob[i] << endl;
    }

    char _num;
    _num = '2';
    cout << "'2' + 'B' = " << _num + 'B' << endl;
    cout << setprecision(2) << "Set precision(2) of 5.323 = " << 5.323 << endl;
    cout << setprecision(1) << "Set precision(1) of 5.323 = " << 5.323 << endl;
    cout << setw(26) << "H I J K L M N O P Q R S T" << endl;
    cout << std::fixed << std::showpoint;
    cout << setw(10) << 20.56 << setw(10) << 50.2 << endl;
    cout << setw(10) << 20.56 << setw(10) << 50.2 << endl;
    // Let's learn about CONSTANT values
    // const dataType identifier = value;
    const double CONVERSION_CENTIMETER = 2.54;
    const int NO_OF_STUDENTS = 20;
    const char BLANK = ' ';
    cout << CONVERSION_CENTIMETER << endl;
    const float CONVERSION = 2.54f;
    cout << CONVERSION << endl;
    cout << 5%7 << endl;
}